

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmx-impl.inc.c
# Opt level: O2

void gen_mtvscr(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 ret;
  uintptr_t o;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  if (ctx->altivec_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx,ret,tcg_ctx->cpu_env,(ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12d20);
    local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_20 = (TCGTemp *)(ret + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_mtvscr_ppc64,(TCGTemp *)0x0,2,&local_28);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x49);
  return;
}

Assistant:

static void gen_mtvscr(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 val;
    int bofs;

    if (unlikely(!ctx->altivec_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VPU);
        return;
    }

    val = tcg_temp_new_i32(tcg_ctx);
    bofs = avr_full_offset(rB(ctx->opcode));
#ifdef HOST_WORDS_BIGENDIAN
    bofs += 3 * 4;
#endif

    tcg_gen_ld_i32(tcg_ctx, val, tcg_ctx->cpu_env, bofs);
    gen_helper_mtvscr(tcg_ctx, tcg_ctx->cpu_env, val);
    tcg_temp_free_i32(tcg_ctx, val);
}